

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_pack_data
              (nghttp2_session *session,nghttp2_bufs *bufs,size_t datamax,nghttp2_frame *frame,
              nghttp2_data_aux_data *aux_data,nghttp2_stream *stream)

{
  uint32_t uVar1;
  nghttp2_data_source_read_length_callback p_Var2;
  uint8_t *puVar3;
  nghttp2_stream *item;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  nghttp2_pq *pq;
  uint32_t uVar9;
  size_t sVar10;
  nghttp2_buf_chain *pnVar11;
  uint32_t data_flags;
  uint32_t local_44;
  nghttp2_bufs *local_40;
  nghttp2_stream *local_38;
  
  pnVar11 = bufs->cur;
  if (bufs->head != pnVar11) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x1e1b,
                  "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                 );
  }
  p_Var2 = (session->callbacks).read_length_callback;
  sVar10 = datamax;
  local_38 = stream;
  if (p_Var2 != (nghttp2_data_source_read_length_callback)0x0) {
    uVar6 = (*p_Var2)(session,(frame->hd).type,stream->stream_id,session->remote_window_size,
                      stream->remote_window_size,(session->remote_settings).max_frame_size,
                      session->user_data);
    if ((long)stream->remote_window_size < (long)uVar6) {
      uVar6 = (long)stream->remote_window_size;
    }
    uVar1 = session->remote_window_size;
    uVar9 = (session->remote_settings).max_frame_size;
    if ((long)uVar6 < (long)(int)uVar1) {
      uVar7 = (long)(int)uVar9;
      if ((long)uVar6 < (long)(int)uVar9) {
        uVar7 = uVar6;
      }
    }
    else {
      if ((int)uVar1 < (int)uVar9) {
        uVar9 = uVar1;
      }
      uVar7 = (long)(int)uVar9;
    }
    if ((long)uVar7 < 1) {
      uVar6 = 0xfffffc7a;
      goto LAB_0047a682;
    }
    sVar10 = uVar7;
    if ((ulong)((long)(pnVar11->buf).end - (long)(pnVar11->buf).last) < uVar7) {
      local_40 = &(session->aob).framebufs;
      iVar4 = nghttp2_bufs_realloc(local_40,uVar7 + 10);
      sVar10 = datamax;
      if (iVar4 == 0) {
        if (local_40 != bufs) {
          __assert_fail("&session->aob.framebufs == bufs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                        ,0x1e3f,
                        "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                       );
        }
        pnVar11 = bufs->cur;
        sVar10 = uVar7;
      }
    }
  }
  if ((ulong)((long)(pnVar11->buf).end - (long)(pnVar11->buf).last) < sVar10) {
    __assert_fail("nghttp2_buf_avail(buf) >= datamax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x1e48,
                  "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                 );
  }
  local_44 = 0;
  uVar7 = (*(aux_data->data_prd).read_callback)
                    (session,(frame->hd).stream_id,(pnVar11->buf).pos,sVar10,&local_44,
                     (nghttp2_data_source *)aux_data,session->user_data);
  if ((uVar7 + 0x20e < 0x13) && ((0x40021UL >> (uVar7 + 0x20e & 0x3f) & 1) != 0)) {
    uVar6 = uVar7 & 0xffffffff;
  }
  else {
    uVar6 = 0xfffffc7a;
    if ((-1 < (long)uVar7) && (uVar7 <= sVar10)) {
      puVar3 = (pnVar11->buf).pos;
      (pnVar11->buf).last = puVar3 + uVar7;
      (pnVar11->buf).pos = puVar3 + -9;
      (frame->hd).flags = '\0';
      if ((((local_44 & 1) != 0) && (aux_data->eof = '\x01', (local_44 & 2) == 0)) &&
         ((aux_data->flags & 1) != 0)) {
        (frame->hd).flags = (frame->hd).flags | 1;
      }
      if ((local_44 & 4) != 0) {
        if ((session->callbacks).send_data_callback == (nghttp2_send_data_callback)0x0)
        goto LAB_0047a682;
        aux_data->no_copy = '\x01';
      }
      (frame->hd).length = uVar7;
      (frame->data).padlen = 0;
      uVar6 = uVar7 + 0x100;
      if (sVar10 < uVar7 + 0x100) {
        uVar6 = sVar10;
      }
      uVar6 = session_call_select_padding(session,frame,uVar6);
      if (-0x385 < (int)uVar6) {
        (frame->ext).payload = (void *)(uVar6 - uVar7);
        nghttp2_frame_pack_frame_hd((pnVar11->buf).pos,&frame->hd);
        uVar5 = nghttp2_frame_add_pad(bufs,&frame->hd,(frame->data).padlen,(uint)aux_data->no_copy);
        item = local_38;
        uVar6 = (ulong)uVar5;
        if (uVar5 == 0) {
          sVar10 = (local_38->item->frame).hd.length;
          local_38->last_writelen = sVar10;
          if ((local_38->flags & 0x10) == 0) {
            nghttp2_stream_reschedule(local_38);
          }
          else if (session->server != '\0') {
            uVar5 = local_38->extpri & 0x7f;
            if (7 < (byte)uVar5) {
              __assert_fail("urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                            ,0x430,
                            "void session_sched_reschedule_stream(nghttp2_session *, nghttp2_stream *)"
                           );
            }
            if ((char)local_38->extpri < '\0') {
              pq = &session->sched[uVar5].ob_data;
              sVar8 = nghttp2_pq_size(pq);
              if (sVar8 != 1) {
                nghttp2_pq_remove(pq,&item->pq_entry);
                item->cycle = item->cycle + sVar10;
                iVar4 = nghttp2_pq_push(pq,&item->pq_entry);
                if (iVar4 != 0) {
                  __assert_fail("0 == rv",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                ,0x43e,
                                "void session_sched_reschedule_stream(nghttp2_session *, nghttp2_stream *)"
                               );
                }
              }
            }
          }
          if (((frame->hd).length != 0) || (uVar6 = 0xfffffde9, (~local_44 & 3) != 0)) {
            uVar6 = 0;
          }
        }
      }
    }
  }
LAB_0047a682:
  return (int)uVar6;
}

Assistant:

int nghttp2_session_pack_data(nghttp2_session *session, nghttp2_bufs *bufs,
                              size_t datamax, nghttp2_frame *frame,
                              nghttp2_data_aux_data *aux_data,
                              nghttp2_stream *stream) {
  int rv;
  uint32_t data_flags;
  ssize_t payloadlen;
  ssize_t padded_payloadlen;
  nghttp2_buf *buf;
  size_t max_payloadlen;

  assert(bufs->head == bufs->cur);

  buf = &bufs->cur->buf;

  if (session->callbacks.read_length_callback) {

    payloadlen = session->callbacks.read_length_callback(
        session, frame->hd.type, stream->stream_id, session->remote_window_size,
        stream->remote_window_size, session->remote_settings.max_frame_size,
        session->user_data);

    DEBUGF("send: read_length_callback=%zd\n", payloadlen);

    payloadlen = nghttp2_session_enforce_flow_control_limits(session, stream,
                                                             payloadlen);

    DEBUGF("send: read_length_callback after flow control=%zd\n", payloadlen);

    if (payloadlen <= 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }

    if ((size_t)payloadlen > nghttp2_buf_avail(buf)) {
      /* Resize the current buffer(s).  The reason why we do +1 for
         buffer size is for possible padding field. */
      rv = nghttp2_bufs_realloc(&session->aob.framebufs,
                                (size_t)(NGHTTP2_FRAME_HDLEN + 1 + payloadlen));

      if (rv != 0) {
        DEBUGF("send: realloc buffer failed rv=%d", rv);
        /* If reallocation failed, old buffers are still in tact.  So
           use safe limit. */
        payloadlen = (ssize_t)datamax;

        DEBUGF("send: use safe limit payloadlen=%zd", payloadlen);
      } else {
        assert(&session->aob.framebufs == bufs);

        buf = &bufs->cur->buf;
      }
    }
    datamax = (size_t)payloadlen;
  }

  /* Current max DATA length is less then buffer chunk size */
  assert(nghttp2_buf_avail(buf) >= datamax);

  data_flags = NGHTTP2_DATA_FLAG_NONE;
  payloadlen = aux_data->data_prd.read_callback(
      session, frame->hd.stream_id, buf->pos, datamax, &data_flags,
      &aux_data->data_prd.source, session->user_data);

  if (payloadlen == NGHTTP2_ERR_DEFERRED ||
      payloadlen == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE ||
      payloadlen == NGHTTP2_ERR_PAUSE) {
    DEBUGF("send: DATA postponed due to %s\n",
           nghttp2_strerror((int)payloadlen));

    return (int)payloadlen;
  }

  if (payloadlen < 0 || datamax < (size_t)payloadlen) {
    /* This is the error code when callback is failed. */
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  buf->last = buf->pos + payloadlen;
  buf->pos -= NGHTTP2_FRAME_HDLEN;

  /* Clear flags, because this may contain previous flags of previous
     DATA */
  frame->hd.flags = NGHTTP2_FLAG_NONE;

  if (data_flags & NGHTTP2_DATA_FLAG_EOF) {
    aux_data->eof = 1;
    /* If NGHTTP2_DATA_FLAG_NO_END_STREAM is set, don't set
       NGHTTP2_FLAG_END_STREAM */
    if ((aux_data->flags & NGHTTP2_FLAG_END_STREAM) &&
        (data_flags & NGHTTP2_DATA_FLAG_NO_END_STREAM) == 0) {
      frame->hd.flags |= NGHTTP2_FLAG_END_STREAM;
    }
  }

  if (data_flags & NGHTTP2_DATA_FLAG_NO_COPY) {
    if (session->callbacks.send_data_callback == NULL) {
      DEBUGF("NGHTTP2_DATA_FLAG_NO_COPY requires send_data_callback set\n");

      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    aux_data->no_copy = 1;
  }

  frame->hd.length = (size_t)payloadlen;
  frame->data.padlen = 0;

  max_payloadlen = nghttp2_min(datamax, frame->hd.length + NGHTTP2_MAX_PADLEN);

  padded_payloadlen =
      session_call_select_padding(session, frame, max_payloadlen);

  if (nghttp2_is_fatal((int)padded_payloadlen)) {
    return (int)padded_payloadlen;
  }

  frame->data.padlen = (size_t)(padded_payloadlen - payloadlen);

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  rv = nghttp2_frame_add_pad(bufs, &frame->hd, frame->data.padlen,
                             aux_data->no_copy);
  if (rv != 0) {
    return rv;
  }

  session_reschedule_stream(session, stream);

  if (frame->hd.length == 0 && (data_flags & NGHTTP2_DATA_FLAG_EOF) &&
      (data_flags & NGHTTP2_DATA_FLAG_NO_END_STREAM)) {
    /* DATA payload length is 0, and DATA frame does not bear
       END_STREAM.  In this case, there is no point to send 0 length
       DATA frame. */
    return NGHTTP2_ERR_CANCEL;
  }

  return 0;
}